

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_pcm.cpp
# Opt level: O2

void __thiscall
ymfm::pcm_registers::cache_channel_data(pcm_registers *this,uint32_t choffs,pcm_cache *cache)

{
  uint32_t uVar1;
  uint uVar2;
  char cVar3;
  uint uVar4;
  int iVar5;
  uint32_t uVar6;
  pcm_registers *this_00;
  uint uVar7;
  long lStack_40;
  
  uVar7 = (int)(char)this->m_regdata[choffs + 0x38] >> 4;
  uVar1 = ch_fnumber(this,choffs);
  cache->step = ((uVar1 | 0x400) << ((char)uVar7 + 7U & 0x1f)) >> 2;
  cache->total_level = (this->m_regdata[choffs + 0x50] & 0xfe) << 9;
  uVar4 = this->m_regdata[choffs + 0x68] & 0xf;
  uVar2 = (int)((uint)this->m_regdata[choffs + 0x68] << 0x1c) >> 0x1c;
  cVar3 = (char)uVar4;
  if ((int)uVar2 < 0) {
    if (uVar2 < 0xfffffff9) {
      cache->pan_right = 0x3ff;
      iVar5 = 0x3ff;
      lStack_40 = 8;
      goto LAB_0014f9ec;
    }
    cache->pan_left = 0;
    iVar5 = 0x3ff;
    if (cVar3 != '\t') {
      iVar5 = uVar2 * -0x20;
    }
  }
  else {
    uVar6 = 0x3ff;
    if (cVar3 != '\a') {
      uVar6 = uVar4 << 5;
    }
    cache->pan_left = uVar6;
    iVar5 = 0;
  }
  lStack_40 = 0xc;
LAB_0014f9ec:
  *(int *)(cache->eg_rate + lStack_40 + -0x14) = iVar5;
  cache->lfo_step = "\x01\f\x13\x19\x1f#%*"[this->m_regdata[choffs + 0x80] >> 3 & 7];
  cache->am_depth = ""[this->m_regdata[choffs + 0xe0] & 7];
  cache->pm_depth = ""[this->m_regdata[choffs + 0x80] & 7];
  uVar2 = (uint)(this->m_regdata[choffs + 0xb0] >> 4);
  cache->eg_sustain = (uVar2 + 1 & 0xfffffff0 | uVar2) << 5;
  uVar2 = (uint)(this->m_regdata[choffs + 200] >> 4);
  uVar6 = 0;
  if (uVar2 != 0xf) {
    uVar7 = uVar7 + uVar2;
    uVar6 = (uVar1 >> 9 & 1) + uVar7 * 2;
  }
  this_00 = (pcm_registers *)(ulong)uVar7;
  uVar1 = effective_rate(this_00,(uint)(this->m_regdata[choffs + 0x98] >> 4),uVar6);
  cache->eg_rate[1] = (uint8_t)uVar1;
  uVar1 = effective_rate(this_00,this->m_regdata[choffs + 0x98] & 0xf,uVar6);
  cache->eg_rate[2] = (uint8_t)uVar1;
  uVar1 = effective_rate(this_00,this->m_regdata[choffs + 0xb0] & 0xf,uVar6);
  cache->eg_rate[3] = (uint8_t)uVar1;
  uVar1 = effective_rate(this_00,this->m_regdata[choffs + 200] & 0xf,uVar6);
  cache->eg_rate[4] = (uint8_t)uVar1;
  cache->eg_rate[5] = '\x05';
  if ((this->m_regdata[choffs + 0x68] & 0x40) != 0) {
    cache->eg_rate[2] = '0';
    cache->eg_rate[3] = '?';
    cache->eg_rate[4] = '?';
    cache->eg_sustain = 0x80;
  }
  return;
}

Assistant:

void pcm_registers::cache_channel_data(uint32_t choffs, pcm_cache &cache)
{
	// compute step from octave and fnumber; the math here implies
	// a .18 fraction but .16 should be perfectly fine
	int32_t octave = int8_t(ch_octave(choffs) << 4) >> 4;
	uint32_t fnum = ch_fnumber(choffs);
	cache.step = ((0x400 | fnum) << (octave + 7)) >> 2;

	// total level is computed as a .10 value for interpolation
	cache.total_level = ch_total_level(choffs) << 10;

	// compute panning values in terms of envelope attenuation
	int32_t panpot = int8_t(ch_panpot(choffs) << 4) >> 4;
	if (panpot >= 0)
	{
		cache.pan_left = (panpot == 7) ? 0x3ff : 0x20 * panpot;
		cache.pan_right = 0;
	}
	else if (panpot >= -7)
	{
		cache.pan_left = 0;
		cache.pan_right = (panpot == -7) ? 0x3ff : -0x20 * panpot;
	}
	else
		cache.pan_left = cache.pan_right = 0x3ff;

	// determine the LFO stepping value; this how much to add to a running
	// x.18 value for the LFO; steps were derived from frequencies in the
	// manual and come out very close with these values
	static const uint8_t s_lfo_steps[8] = { 1, 12, 19, 25, 31, 35, 37, 42 };
	cache.lfo_step = s_lfo_steps[ch_lfo_speed(choffs)];

	// AM LFO depth values, derived from the manual; note each has at most
	// 2 bits to make the "multiply" easy in hardware
	static const uint8_t s_am_depth[8] = { 0, 0x14, 0x20, 0x28, 0x30, 0x40, 0x50, 0x80 };
	cache.am_depth = s_am_depth[ch_am_depth(choffs)];

	// PM LFO depth values; these are converted from the manual's cents values
	// into f-numbers; the computations come out quite cleanly so pretty sure
	// these are correct
	static const uint8_t s_pm_depth[8] = { 0, 2, 3, 4, 6, 12, 24, 48 };
	cache.pm_depth = s_pm_depth[ch_vibrato(choffs)];

	// 4-bit sustain level, but 15 means 31 so effectively 5 bits
	cache.eg_sustain = ch_sustain_level(choffs);
	cache.eg_sustain |= (cache.eg_sustain + 1) & 0x10;
	cache.eg_sustain <<= 5;

	// compute the key scaling correction factor; 15 means don't do any correction
	int32_t correction = ch_rate_correction(choffs);
	if (correction == 15)
		correction = 0;
	else
		correction = (octave + correction) * 2 + bitfield(fnum, 9);

	// compute the envelope generator rates
	cache.eg_rate[EG_ATTACK] = effective_rate(ch_attack_rate(choffs), correction);
	cache.eg_rate[EG_DECAY] = effective_rate(ch_decay_rate(choffs), correction);
	cache.eg_rate[EG_SUSTAIN] = effective_rate(ch_sustain_rate(choffs), correction);
	cache.eg_rate[EG_RELEASE] = effective_rate(ch_release_rate(choffs), correction);
	cache.eg_rate[EG_REVERB] = 5;

	// if damping is on, override some things; essentially decay at a hardcoded
	// rate of 48 until -12db (0x80), then at maximum rate for the rest
	if (ch_damp(choffs) != 0)
	{
		cache.eg_rate[EG_DECAY] = 48;
		cache.eg_rate[EG_SUSTAIN] = 63;
		cache.eg_rate[EG_RELEASE] = 63;
		cache.eg_sustain = 0x80;
	}
}